

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cond_eq.h
# Opt level: O0

void __thiscall
mp::
CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
::ConvertCtxNeg(CondEQConverter_MIP<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::LinTerms>
                *this,ItemType *eq0c,int param_3)

{
  double dVar1;
  initializer_list<double> __l;
  bool bVar2;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *this_00;
  reference pvVar3;
  FunctionalConstraint *in_RSI;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_RDI;
  NodeRange NVar4;
  vector<int,_std::allocator<int>_> newvars;
  double cmpEps;
  PreprocessInfoStd bNt;
  bool valid;
  int res;
  ConType *con;
  undefined8 in_stack_fffffffffffff6f8;
  int var;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff700;
  LinTerms *in_stack_fffffffffffff708;
  MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff710;
  undefined4 in_stack_fffffffffffff71c;
  undefined1 uVar5;
  LinTerms *in_stack_fffffffffffff720;
  LinTerms *le;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_fffffffffffff728;
  AlgConRhs<_1> in_stack_fffffffffffff730;
  undefined8 in_stack_fffffffffffff738;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  LinTerms *in_stack_fffffffffffff748;
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffff750;
  undefined8 in_stack_fffffffffffff758;
  Type type;
  double in_stack_fffffffffffff760;
  vector<int,_std::allocator<int>_> *v;
  vector<double,_std::allocator<double>_> *c;
  LinTerms *in_stack_fffffffffffff770;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_fffffffffffff778;
  double in_stack_fffffffffffff7a8;
  double dVar6;
  double in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7b8;
  int var_00;
  AlgConRhs<1> local_828 [61];
  NodeRange local_640;
  AlgConRhs<_1> local_630 [36];
  LinTerms local_510;
  NodeRange local_448;
  AlgConRhs<1> local_438;
  undefined1 local_429 [25];
  undefined1 *local_410;
  undefined8 local_408;
  vector<double,_std::allocator<double>_> local_2d0;
  NodeRange local_2b8;
  AlgConRhs<_1> local_2a8 [36];
  NodeRange local_188;
  AlgConRhs<1> local_168 [36];
  double local_48;
  PreprocessInfo<int> local_40;
  undefined1 local_25;
  int local_24;
  ConType *local_20;
  FunctionalConstraint *local_10;
  
  uVar5 = (undefined1)((uint)in_stack_fffffffffffff71c >> 0x18);
  type = (Type)((ulong)in_stack_fffffffffffff758 >> 0x20);
  var = (int)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
  var_00 = (int)((ulong)in_stack_fffffffffffff7b8 >> 0x20);
  local_10 = in_RSI;
  local_20 = ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>::
             GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>_>
                            *)0x22c52b);
  local_24 = FunctionalConstraint::GetResultVar(local_10);
  bVar2 = AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::empty
                    ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_> *)0x22c554);
  if (bVar2) {
    dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
    local_25 = dVar6 == 0.0;
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::NarrowVarBounds(in_RDI,var_00,in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    return;
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  bVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_fffffffffffff700,var);
  if (bVar2) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    dVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_fffffffffffff700,var);
    if (dVar6 != 0.0) {
      return;
    }
    if (NAN(dVar6)) {
      return;
    }
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  BoundComputations<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::ComputeBoundsAndType(in_stack_fffffffffffff750,in_stack_fffffffffffff748);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  PreprocessInfo<int>::get_result_type(&local_40);
  local_48 = MIPFlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
             ::ComparisonEps(in_stack_fffffffffffff710,
                             (Type)((ulong)in_stack_fffffffffffff708 >> 0x20));
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  bVar2 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::is_fixed(in_stack_fffffffffffff700,var);
  if (bVar2) {
    BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
             *)in_RDI);
    dVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::fixed_value(in_stack_fffffffffffff700,var);
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      dVar6 = PreprocessInfo<int>::lb(&local_40);
      dVar1 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
      if (dVar1 - local_48 < dVar6) {
        BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)in_RDI);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
        LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
        AlgConRhs<1>::AlgConRhs(local_168,dVar6 + local_48);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffff728
                   ,in_stack_fffffffffffff720,(AlgConRhs<1>)in_stack_fffffffffffff730.rhs_,
                   (bool)uVar5);
        local_188 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_fffffffffffff730.rhs_,
                               (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                               in_stack_fffffffffffff728);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffff700
                  );
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff700);
        return;
      }
      dVar6 = PreprocessInfo<int>::ub(&local_40);
      dVar1 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
      if (dVar6 < dVar1 + local_48) {
        BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
        ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                 *)in_RDI);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
        LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
        dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
        AlgConRhs<-1>::AlgConRhs(local_2a8,dVar6 - local_48);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff728,in_stack_fffffffffffff720,in_stack_fffffffffffff730,
                   (bool)uVar5);
        local_2b8 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
                    ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>
                              ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                                *)in_stack_fffffffffffff730.rhs_,
                               (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                               in_stack_fffffffffffff728);
        AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
                  ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                   in_stack_fffffffffffff700);
        LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff700);
        return;
      }
    }
  }
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  c = &local_2d0;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::AddVars_returnIds(in_stack_fffffffffffff778,(size_t)in_stack_fffffffffffff770,(double)c,
                      in_stack_fffffffffffff760,type);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff710,
             (value_type *)in_stack_fffffffffffff708);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  local_429._17_8_ = 0x3ff0000000000000;
  local_429._1_8_ = 0x3ff0000000000000;
  local_429._9_8_ = 0x3ff0000000000000;
  local_410 = local_429 + 1;
  local_408 = 3;
  v = (vector<int,_std::allocator<int>_> *)local_429;
  std::allocator<double>::allocator((allocator<double> *)0x22ca74);
  __l._M_len._0_4_ = in_stack_fffffffffffff740;
  __l._M_array = (iterator)in_stack_fffffffffffff738;
  __l._M_len._4_4_ = in_stack_fffffffffffff744;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff730.rhs_,__l,
             (allocator_type *)in_stack_fffffffffffff728);
  LinTerms::LinTerms(in_stack_fffffffffffff770,c,v);
  AlgConRhs<1>::AlgConRhs(&local_438,1.0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffff728,
             in_stack_fffffffffffff720,(AlgConRhs<1>)in_stack_fffffffffffff730.rhs_,(bool)uVar5);
  local_448 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
              ::AddConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)in_stack_fffffffffffff730.rhs_,
                         (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                         in_stack_fffffffffffff728);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)in_stack_fffffffffffff700);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff700);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff710);
  std::allocator<double>::~allocator((allocator<double> *)0x22cb5f);
  BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *)in_RDI);
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)&local_2d0,0);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  LinTerms::LinTerms((LinTerms *)in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
  AlgConRhs<-1>::AlgConRhs(local_630,dVar6 - local_48);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)in_stack_fffffffffffff728,
             in_stack_fffffffffffff720,in_stack_fffffffffffff730,(bool)uVar5);
  le = &local_510;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  IndicatorConstraint((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_>
                       *)in_stack_fffffffffffff710,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
                      (int)in_stack_fffffffffffff708,
                      (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)
                      in_stack_fffffffffffff700);
  NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_1>>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)in_stack_fffffffffffff730.rhs_,in_stack_fffffffffffff728);
  local_640 = NVar4;
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>_>::
  ~IndicatorConstraint
            ((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_>_> *)
             in_stack_fffffffffffff700);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<_1>_> *)in_stack_fffffffffffff700);
  LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff700);
  this_00 = (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
            BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
            ::GetMC((BasicItemConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)in_RDI);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&local_2d0,1);
  uVar5 = (undefined1)((uint)*pvVar3 >> 0x18);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<0>_>::GetBody(local_20);
  LinTerms::LinTerms((LinTerms *)this_00,in_stack_fffffffffffff708);
  dVar6 = AlgConRhs<0>::rhs(&local_20->super_AlgConRhs<0>);
  AlgConRhs<1>::AlgConRhs(local_828,dVar6 + local_48);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar4.ir_,le,
             (AlgConRhs<1>)NVar4.pvn_,(bool)uVar5);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  IndicatorConstraint(this_00,(int)((ulong)in_stack_fffffffffffff708 >> 0x20),
                      (int)in_stack_fffffffffffff708,
                      (AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)
                      in_stack_fffffffffffff700);
  NVar4 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>
          ::
          AddConstraint<mp::IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<1>>>>
                    ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                      *)NVar4.pvn_,
                     (IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>
                      *)NVar4.ir_);
  IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_>::
  ~IndicatorConstraint
            ((IndicatorConstraint<mp::AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>_> *)
             NVar4.ir_);
  AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint
            ((AlgebraicConstraint<mp::LinTerms,_mp::AlgConRhs<1>_> *)NVar4.ir_);
  LinTerms::~LinTerms((LinTerms *)NVar4.ir_);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void ConvertCtxNeg(const ItemType& eq0c, int ) {
    const auto& con = eq0c.GetConstraint();
    const auto res = eq0c.GetResultVar();
    if (con.empty()) {
      bool valid = !con.rhs();
      GetMC().NarrowVarBounds(res, valid, valid);
    } else if ( !GetMC().is_fixed(res) ||   // not fixed, or
                !GetMC().fixed_value(res) ) // fixed to 0
    {
      auto bNt = GetMC().ComputeBoundsAndType(con.GetBody());
      double cmpEps = GetMC().ComparisonEps( bNt.get_result_type() );
#define COND_LIN_EQ__USE_FLAT_ALGEBRA
#ifndef COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Not doing this.
      // Reason: the below OR propagates CTX+ into res,
      // which is the expression we are redefining,
      // but this is not necessary. See #248.
      // Happens on eqVarConst01.mod.
      /// res3 ==> (res || body <= rhs-eps || body >= rhs+eps)
      auto res3 = GetMC().AssignResultVar2Args(
          OrConstraint{ {
            res,
            GetMC().AssignResultVar2Args(   // <=
                ConditionalConstraint< AlgCon<-1> >
                { { con.GetBody(), con.rhs() - cmpEps } }),
            GetMC().AssignResultVar2Args(   // >=
                ConditionalConstraint< AlgCon<1> >
                { { con.GetBody(), con.rhs() + cmpEps } })
          } });
      GetMC().FixAsTrue(res3);
#else  // COND_LIN_EQ__USE_FLAT_ALGEBRA
      // Old way: straight to algebra and indicators.
      // This could duplicate the below indicators,
      // but simpler as of now:
      // the indicators redefine conditional inequalities
      // which, in the above variant, could have been redefined
      // in CTX- before, see int_ne_05_redef_ctx.mod,
      // thus losing the CTX+ redefinition, see #248.
      if (GetMC().is_fixed(res)  // This prepro would be unnec with logicals
          && !GetMC().fixed_value(res)) {  // preprocess: fixed to 0
        if (bNt.lb() > con.rhs() - cmpEps) { // body > value-eps
          GetMC().AddConstraint(
              AlgCon<1>{ con.GetBody(), con.rhs() + cmpEps } );
          return;
        }
        if (bNt.ub() < con.rhs() + cmpEps) { // body < value+eps
          GetMC().AddConstraint(
              AlgCon<-1>{ con.GetBody(), con.rhs() - cmpEps } );
          return;
        }
      }
      auto newvars = GetMC().AddVars_returnIds(2, 0.0, 1.0, var::INTEGER);
      newvars.push_back( res );
      GetMC().AddConstraint( LinConGE(   // b1+b2+resvar >= 1
          {{1.0, 1.0, 1.0}, newvars},
          1.0 ) );
      {
        GetMC().AddConstraint(IndicatorConstraint< AlgCon<-1> >(
            newvars[0], 1,
            { con.GetBody(),
             con.rhs() - cmpEps }));
      }
      GetMC().AddConstraint(IndicatorConstraint< AlgCon<1> >(
          newvars[1], 1,
          { con.GetBody(),
           con.rhs() + cmpEps }));
#endif  // USE_FLAT_ALGEBRA
    } // else, skip
  }